

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_free(void *p,ma_allocation_callbacks *pAllocationCallbacks)

{
  undefined8 *in_RSI;
  long in_RDI;
  void *in_stack_ffffffffffffffe8;
  
  if (in_RDI != 0) {
    if (in_RSI == (undefined8 *)0x0) {
      ma__free_default((void *)0x0,in_stack_ffffffffffffffe8);
    }
    else if (in_RSI[3] != 0) {
      (*(code *)in_RSI[3])(in_RDI,*in_RSI);
    }
  }
  return;
}

Assistant:

MA_API void ma_free(void* p, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (p == NULL) {
        return;
    }

    if (pAllocationCallbacks != NULL) {
        if (pAllocationCallbacks->onFree != NULL) {
            pAllocationCallbacks->onFree(p, pAllocationCallbacks->pUserData);
        } else {
            return; /* Do no fall back to the default implementation. */
        }
    } else {
        ma__free_default(p, NULL);
    }
}